

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  int iVar1;
  size_t sVar2;
  secp256k1_context *prealloc_00;
  secp256k1_context *psVar3;
  long lVar4;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *extraout_RDX_00;
  secp256k1_gej *extraout_RDX_01;
  secp256k1_gej *psVar5;
  secp256k1_gej *extraout_RDX_02;
  undefined1 *data;
  uint flags_00;
  uint64_t *puVar6;
  bool bVar7;
  byte bVar8;
  uchar out [32];
  secp256k1_gej gj;
  
  bVar8 = 0;
  gj.x.n[0] = 0xbb67ae856a09e667;
  gj.x.n[1] = 0xa54ff53a3c6ef372;
  gj.x.n[2] = 0x9b05688c510e527f;
  gj.x.n[3] = 0x5be0cd191f83d9ab;
  gj.z.n[2] = 0;
  secp256k1_sha256_write
            ((secp256k1_sha256 *)&gj,
             (uchar *)"For this sample, this 63-byte string will be used as input data",0x3f);
  secp256k1_sha256_finalize((secp256k1_sha256 *)&gj,out);
  data = secp256k1_selftest_sha256_output32;
  iVar1 = secp256k1_memcmp_var(out,secp256k1_selftest_sha256_output32,0x20);
  if (iVar1 == 0) {
    sVar2 = secp256k1_context_preallocated_size(flags);
    if (sVar2 == 0) {
      prealloc = (secp256k1_context *)0x0;
    }
    else {
      *(secp256k1_callback *)((long)prealloc + 0xb8) = default_illegal_callback;
      *(secp256k1_callback *)((long)prealloc + 200) = default_error_callback;
      *(undefined8 *)((long)prealloc + 0x10) = 0;
      *(undefined8 *)prealloc = 0;
      *(undefined8 *)((long)prealloc + 8) = 0;
      psVar5 = extraout_RDX;
      if ((flags >> 9 & 1) != 0) {
        *(secp256k1_ge_storage (**) [16])((long)prealloc + 0x10) = secp256k1_ecmult_static_context;
        secp256k1_ecmult_gen_blind
                  ((secp256k1_ecmult_gen_context *)((long)prealloc + 0x10),(uchar *)0x0);
        psVar5 = extraout_RDX_00;
      }
      if (((flags >> 8 & 1) != 0) && (*prealloc == 0)) {
        gj.infinity = 0;
        gj.x.n[0] = 0x2815b16f81798;
        gj.x.n[1] = 0xdb2dce28d959f;
        gj.x.n[2] = 0xe870b07029bfc;
        gj.x.n[3] = 0xbbac55a06295c;
        gj.x.n[4] = 0x79be667ef9dc;
        gj.y.n[0] = 0x7d08ffb10d4b8;
        gj.y.n[1] = 0x48a68554199c4;
        gj.y.n[2] = 0xe1108a8fd17b4;
        gj.y.n[3] = 0xc4655da4fbfc0;
        gj.y.n[4] = 0x483ada7726a3;
        gj.z.n[0] = 1;
        gj.z.n[1] = 0;
        gj.z.n[2] = 0;
        gj.z.n[3] = 0;
        gj.z.n[4] = 0;
        *(long *)prealloc = (long)prealloc + 0xe0;
        secp256k1_ecmult_odd_multiples_table_storage_var
                  ((int)((long)prealloc + 0xe0),(secp256k1_ge_storage *)&gj,psVar5);
        *(long *)((long)prealloc + 8) = (long)prealloc + 0x800e0;
        psVar5 = &gj;
        puVar6 = (uint64_t *)out;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar6 = (psVar5->x).n[0];
          psVar5 = (secp256k1_gej *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
          puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
        }
        iVar1 = 0x80;
        psVar5 = extraout_RDX_01;
        while (bVar7 = iVar1 != 0, iVar1 = iVar1 + -1, bVar7) {
          secp256k1_gej_double_var((secp256k1_gej *)out,(secp256k1_gej *)out,(secp256k1_fe *)0x0);
          psVar5 = extraout_RDX_02;
        }
        secp256k1_ecmult_odd_multiples_table_storage_var
                  ((int)*(undefined8 *)((long)prealloc + 8),(secp256k1_ge_storage *)out,psVar5);
      }
      *(uint *)((long)prealloc + 0xd8) = flags >> 10 & 1;
    }
    return (secp256k1_context *)prealloc;
  }
  flags_00 = 0x51e00e;
  secp256k1_default_error_callback_fn("self test failed",data);
  sVar2 = secp256k1_context_preallocated_size(flags_00);
  prealloc_00 = (secp256k1_context *)checked_malloc(&default_error_callback,sVar2);
  psVar3 = secp256k1_context_preallocated_create(prealloc_00,flags_00);
  if (psVar3 == (secp256k1_context *)0x0) {
    free(prealloc_00);
    prealloc_00 = (secp256k1_context *)0x0;
  }
  return prealloc_00;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return (secp256k1_context*) ret;
}